

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O0

void __thiscall TeamCityTestOutput::printFailure(TeamCityTestOutput *this,TestFailure *failure)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  TeamCityTestOutput *this_00;
  TestFailure *in_RSI;
  long *in_RDI;
  char *in_stack_ffffffffffffff68;
  TeamCityTestOutput *in_stack_ffffffffffffff70;
  char local_50 [64];
  TestFailure *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0x58))(in_RDI,"##teamcity[testFailed name=\'");
  (*local_10->_vptr_TestFailure[4])();
  SimpleString::asCharString((SimpleString *)0x17860c);
  printEscaped(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  SimpleString::~SimpleString((SimpleString *)0x178631);
  (**(code **)(*in_RDI + 0x58))(in_RDI,"\' message=\'");
  bVar1 = TestFailure::isOutsideTestFile((TestFailure *)0x178650);
  if ((bVar1) || (bVar1 = TestFailure::isInHelperFunction(local_10), bVar1)) {
    (**(code **)(*in_RDI + 0x58))(in_RDI,"TEST failed (");
    (*local_10->_vptr_TestFailure[7])();
    pcVar3 = SimpleString::asCharString((SimpleString *)0x1786a4);
    (**(code **)(*in_RDI + 0x58))(in_RDI,pcVar3);
    SimpleString::~SimpleString((SimpleString *)0x1786ca);
    (**(code **)(*in_RDI + 0x58))(in_RDI,":");
    iVar2 = (*local_10->_vptr_TestFailure[8])();
    (**(code **)(*in_RDI + 0x68))(in_RDI,iVar2);
    (**(code **)(*in_RDI + 0x58))(in_RDI,"): ");
  }
  pcVar3 = local_50;
  (*local_10->_vptr_TestFailure[2])();
  this_00 = (TeamCityTestOutput *)SimpleString::asCharString((SimpleString *)0x178774);
  printEscaped(this_00,pcVar3);
  SimpleString::~SimpleString((SimpleString *)0x178796);
  (**(code **)(*in_RDI + 0x58))(in_RDI,":");
  iVar2 = (*local_10->_vptr_TestFailure[5])();
  (**(code **)(*in_RDI + 0x68))(in_RDI,iVar2);
  (**(code **)(*in_RDI + 0x58))(in_RDI,"\' details=\'");
  (*local_10->_vptr_TestFailure[6])();
  SimpleString::asCharString((SimpleString *)0x178805);
  printEscaped(this_00,pcVar3);
  SimpleString::~SimpleString((SimpleString *)0x178827);
  (**(code **)(*in_RDI + 0x58))(in_RDI,"\']\n");
  return;
}

Assistant:

void TeamCityTestOutput::printFailure(const TestFailure& failure)
{
    print("##teamcity[testFailed name='");
    printEscaped(failure.getTestNameOnly().asCharString());
    print("' message='");
    if (failure.isOutsideTestFile() || failure.isInHelperFunction()) {
        print("TEST failed (");
        print(failure.getTestFileName().asCharString());
        print(":");
        print(failure.getTestLineNumber());
        print("): ");
    }

    printEscaped(failure.getFileName().asCharString());
    print(":");
    print(failure.getFailureLineNumber());

    print("' details='");
    printEscaped(failure.getMessage().asCharString());
    print("']\n");
}